

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* serviceFlagsToStr_abi_cxx11_
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,uint64_t flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  ulong local_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_58.field_2;
  uVar3 = 0;
  do {
    lVar2 = 1L << ((byte)uVar3 & 0x3f);
    if ((flags >> (uVar3 & 0x3f) & 1) != 0) {
      local_60 = uVar3;
      if (lVar2 < 0x40) {
        if (lVar2 == 1) {
          local_58.field_2._M_local_buf[4] = 'O';
          local_58.field_2._M_local_buf[5] = 'R';
          local_58.field_2._M_local_buf[6] = 'K';
          local_58.field_2._M_allocated_capacity._0_4_ = 0x5754454e;
LAB_006db498:
          local_58._M_string_length = 7;
          local_58.field_2._M_local_buf[7] = '\0';
          local_58._M_dataplus._M_p = (pointer)paVar1;
        }
        else if (lVar2 == 4) {
          local_58.field_2._M_local_buf[4] = 'M';
          local_58.field_2._M_allocated_capacity._0_4_ = 0x4f4f4c42;
          local_58._M_string_length = 5;
          local_58.field_2._M_local_buf[5] = '\0';
          local_58._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          if (lVar2 == 8) {
            local_58.field_2._M_local_buf[4] = 'E';
            local_58.field_2._M_local_buf[5] = 'S';
            local_58.field_2._M_local_buf[6] = 'S';
            local_58.field_2._M_allocated_capacity._0_4_ = 0x4e544957;
            goto LAB_006db498;
          }
LAB_006db4ce:
          tinyformat::format<unsigned_long>(&local_58,"UNKNOWN[2^%u]",&local_60);
        }
      }
      else {
        if (lVar2 == 0x40) {
          local_58.field_2._8_7_ = 0x535245544c4946;
          local_58.field_2._M_allocated_capacity._0_4_ = 0x504d4f43;
          local_58.field_2._M_local_buf[4] = 'A';
          local_58.field_2._M_local_buf[5] = 'C';
          local_58.field_2._M_local_buf[6] = 'T';
        }
        else {
          if (lVar2 != 0x400) {
            if (lVar2 != 0x800) goto LAB_006db4ce;
            local_58.field_2._M_local_buf[4] = 'V';
            local_58.field_2._M_local_buf[5] = '2';
            local_58.field_2._M_allocated_capacity._0_4_ = 0x5f503250;
            local_58._M_string_length = 6;
            local_58.field_2._M_local_buf[6] = '\0';
            local_58._M_dataplus._M_p = (pointer)paVar1;
            goto LAB_006db52b;
          }
          local_58.field_2._8_7_ = 0x444554494d494c;
          local_58.field_2._M_allocated_capacity._0_4_ = 0x5754454e;
          local_58.field_2._M_local_buf[4] = 'O';
          local_58.field_2._M_local_buf[5] = 'R';
          local_58.field_2._M_local_buf[6] = 'K';
        }
        local_58.field_2._M_local_buf[7] = '_';
        local_58._M_string_length = 0xf;
        local_58.field_2._M_local_buf[0xf] = '\0';
        local_58._M_dataplus._M_p = (pointer)paVar1;
      }
LAB_006db52b:
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT17(local_58.field_2._M_local_buf[7],
                                 CONCAT16(local_58.field_2._M_local_buf[6],
                                          CONCAT15(local_58.field_2._M_local_buf[5],
                                                   CONCAT14(local_58.field_2._M_local_buf[4],
                                                            local_58.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
    }
    uVar3 = uVar3 + 1;
    if (uVar3 == 0x40) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

std::vector<std::string> serviceFlagsToStr(uint64_t flags)
{
    std::vector<std::string> str_flags;

    for (size_t i = 0; i < sizeof(flags) * 8; ++i) {
        if (flags & (1ULL << i)) {
            str_flags.emplace_back(serviceFlagToStr(i));
        }
    }

    return str_flags;
}